

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O3

void absl::lts_20240722::inlined_vector_internal::
     ConstructElements<std::allocator<absl::lts_20240722::status_internal::Payload>,absl::lts_20240722::inlined_vector_internal::IteratorValueAdapter<std::allocator<absl::lts_20240722::status_internal::Payload>,absl::lts_20240722::status_internal::Payload_const*>>
               (type_identity_t<std::allocator<absl::lts_20240722::status_internal::Payload>_>
                *allocator,
               Pointer<std::allocator<absl::lts_20240722::status_internal::Payload>_>
               construct_first,
               IteratorValueAdapter<std::allocator<absl::lts_20240722::status_internal::Payload>,_const_absl::lts_20240722::status_internal::Payload_*>
               *values,SizeType<std::allocator<absl::lts_20240722::status_internal::Payload>_>
                       construct_size)

{
  Payload *__args;
  SizeType<std::allocator<absl::lts_20240722::status_internal::Payload>_> SVar1;
  
  if (construct_size != 0) {
    __args = values->it_;
    SVar1 = 0;
    do {
      __gnu_cxx::new_allocator<absl::lts_20240722::status_internal::Payload>::
      construct<absl::lts_20240722::status_internal::Payload,absl::lts_20240722::status_internal::Payload_const&>
                ((new_allocator<absl::lts_20240722::status_internal::Payload> *)allocator,
                 construct_first,__args);
      __args = values->it_ + 1;
      values->it_ = __args;
      SVar1 = SVar1 + 1;
      construct_first = construct_first + 1;
    } while (construct_size != SVar1);
  }
  return;
}

Assistant:

void ConstructElements(absl::internal::type_identity_t<A>& allocator,
                       Pointer<A> construct_first, ValueAdapter& values,
                       SizeType<A> construct_size) {
  for (SizeType<A> i = 0; i < construct_size; ++i) {
    ABSL_INTERNAL_TRY { values.ConstructNext(allocator, construct_first + i); }
    ABSL_INTERNAL_CATCH_ANY {
      DestroyAdapter<A>::DestroyElements(allocator, construct_first, i);
      ABSL_INTERNAL_RETHROW;
    }